

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O2

LispPTR N_OP_misc4(LispPTR data,LispPTR base,LispPTR typenumber,LispPTR inx,int alpha)

{
  ulong uVar1;
  uint uVar2;
  DLword *pDVar3;
  uint uVar4;
  LispPTR *pLVar5;
  byte bVar6;
  LispPTR LVar7;
  byte *pbVar8;
  LispPTR LVar9;
  
  if (alpha != 7) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  uVar1 = (ulong)base;
  if ((inx & 0xfff0000) == 0xe0000) {
    LVar7 = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar5 = NativeAligned4FromLAddr(inx);
    LVar7 = *pLVar5;
    if ((int)LVar7 < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((typenumber & 0xfff0000) == 0xe0000) {
    uVar4 = typenumber & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(typenumber >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar5 = NativeAligned4FromLAddr(typenumber);
    uVar4 = *pLVar5;
    if ((int)uVar4 < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  pDVar3 = MDStypetbl;
  uVar2 = data >> 8;
  if (uVar4 == 0) {
    if ((data & 0xfff0000) == 0xe0000) {
      uVar4 = data & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar2 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar5 = NativeAligned4FromLAddr(data);
      uVar4 = *pLVar5;
      if ((int)uVar4 < 0) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
    }
    if (1 < uVar4) {
      MachineState.errorexit = 1;
      MachineState.tosvalue = inx;
      return 0xffffffff;
    }
    pbVar8 = (byte *)((long)Lisp_world + (ulong)(LVar7 >> 3) + uVar1 * 2 ^ 3);
    bVar6 = *pbVar8;
    if (uVar4 == 0) {
      bVar6 = bVar6 & (char)(-1 << (~(byte)LVar7 & 7)) - 1U;
    }
    else {
      bVar6 = bVar6 | (byte)(1 << (~(byte)LVar7 & 7));
    }
    *pbVar8 = bVar6;
    return data;
  }
  if (uVar4 == 3) {
    if ((data & 0xfff0000) == 0xe0000) {
      uVar4 = data & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(uVar2 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar5 = NativeAligned4FromLAddr(data);
      uVar4 = *pLVar5;
      if ((int)uVar4 < 0) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
    }
    if (0xff < uVar4) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    *(char *)((long)Lisp_world + (ulong)LVar7 + uVar1 * 2 ^ 3) = (char)uVar4;
    return data;
  }
  if (uVar4 == 4) {
    uVar4 = data;
    if ((data & 0xfff0000) != 0xe0000) {
      if ((*(ushort *)((ulong)(uVar2 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pLVar5 = NativeAligned4FromLAddr(data);
      uVar4 = *pLVar5;
      if ((int)uVar4 < 0) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if (0xffff < uVar4) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
    }
    *(short *)((ulong)(Lisp_world + uVar1 + LVar7) ^ 2) = (short)uVar4;
    return data;
  }
  if (uVar4 == 0x14) {
    if (((data & 0xfff8000) != 0xf8000) && ((data & 0xfff8000) != 0xe0000)) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
LAB_00107e9f:
    *(short *)((ulong)(Lisp_world + uVar1 + LVar7) ^ 2) = (short)data;
    return data;
  }
  if (uVar4 == 0x16) {
    if ((data & 0xfff0000) == 0xf0000) {
      LVar9 = data | 0xffff0000;
      goto LAB_001080a3;
    }
    if ((data & 0xfff0000) == 0xe0000) {
      LVar9 = data & 0xffff;
      goto LAB_001080a3;
    }
    if ((*(ushort *)((ulong)(uVar2 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  else {
    if (uVar4 == 0x56) {
      pLVar5 = NativeAligned4FromLAddr(base);
      pLVar5[LVar7] = data;
      return data;
    }
    if (uVar4 != 0x36) {
      if (uVar4 == 0x43) {
        if ((data & 0xfff0000) != 0x70000) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 0xff00) != 0) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        *(char *)((long)Lisp_world + (ulong)LVar7 + uVar1 * 2 ^ 3) = (char)data;
        return data;
      }
      if (uVar4 != 0x44) {
        if (uVar4 != 0x26) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        pLVar5 = NativeAligned4FromLAddr(base);
        if ((-1 < *(short *)((ulong)(pDVar3 + (pLVar5[LVar7] >> 9)) ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          LVar9 = *Reclaim_cnt_word;
          pLVar5 = NativeAligned4FromLAddr(base);
          if (LVar9 == 0) {
            rec_htfind(pLVar5[LVar7],1);
          }
          else {
            htfind(pLVar5[LVar7],1);
          }
        }
        if ((-1 < *(short *)((ulong)(uVar2 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          if (*Reclaim_cnt_word == 0) {
            rec_htfind(data,0);
          }
          else {
            htfind(data,0);
          }
        }
        pLVar5 = NativeAligned4FromLAddr(base);
        pLVar5[LVar7] = data;
        return data;
      }
      if ((data & 0xfff0000) != 0x70000) {
        MachineState.tosvalue = inx;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      goto LAB_00107e9f;
    }
    if ((*(ushort *)((ulong)(uVar2 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 3) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  pLVar5 = NativeAligned4FromLAddr(data);
  LVar9 = *pLVar5;
LAB_001080a3:
  pLVar5 = NativeAligned4FromLAddr(base);
  pLVar5[LVar7] = LVar9;
  return data;
}

Assistant:

LispPTR N_OP_misc4(LispPTR data, LispPTR base, LispPTR typenumber,
                   LispPTR inx, int alpha) {
  int index, type;

  if (alpha != 7) ERROR_EXIT(inx);

  /*  test and setup index  */
  N_GetPos(inx, index, inx);

  /*  test and setup typenumber  */
  N_GetPos(typenumber, type, inx);

  aset_switch(type, inx);

doufn:
  ERROR_EXIT(inx);

}